

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O0

int Cudd_EnableReorderingReporting(DdManager *dd)

{
  int iVar1;
  DdManager *dd_local;
  
  iVar1 = Cudd_AddHook(dd,Cudd_StdPreReordHook,CUDD_PRE_REORDERING_HOOK);
  if (iVar1 == 0) {
    dd_local._4_4_ = 0;
  }
  else {
    iVar1 = Cudd_AddHook(dd,Cudd_StdPostReordHook,CUDD_POST_REORDERING_HOOK);
    if (iVar1 == 0) {
      dd_local._4_4_ = 0;
    }
    else {
      dd_local._4_4_ = 1;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_EnableReorderingReporting(
  DdManager *dd)
{
    if (!Cudd_AddHook(dd, Cudd_StdPreReordHook, CUDD_PRE_REORDERING_HOOK)) {
        return(0);
    }
    if (!Cudd_AddHook(dd, Cudd_StdPostReordHook, CUDD_POST_REORDERING_HOOK)) {
        return(0);
    }
    return(1);

}